

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCTestMultiProcessHandler.cxx
# Opt level: O0

Value * DumpTimeoutAfterMatch(Value *__return_storage_ptr__,cmCTestTestProperties *testProperties)

{
  Value *pVVar1;
  rep_conflict value;
  Value local_80;
  Value local_48;
  undefined1 local_19;
  cmCTestTestProperties *local_18;
  cmCTestTestProperties *testProperties_local;
  Value *timeoutAfterMatch;
  
  local_19 = 0;
  local_18 = testProperties;
  testProperties_local = (cmCTestTestProperties *)__return_storage_ptr__;
  Json::Value::Value(__return_storage_ptr__,objectValue);
  value = std::chrono::duration<double,_std::ratio<1L,_1L>_>::count(&local_18->AlternateTimeout);
  Json::Value::Value(&local_48,value);
  pVVar1 = Json::Value::operator[](__return_storage_ptr__,"timeout");
  Json::Value::operator=(pVVar1,&local_48);
  Json::Value::~Value(&local_48);
  DumpRegExToJsonArray(&local_80,&local_18->TimeoutRegularExpressions);
  pVVar1 = Json::Value::operator[](__return_storage_ptr__,"regex");
  Json::Value::operator=(pVVar1,&local_80);
  Json::Value::~Value(&local_80);
  return __return_storage_ptr__;
}

Assistant:

static Json::Value DumpTimeoutAfterMatch(
  cmCTestTestHandler::cmCTestTestProperties& testProperties)
{
  Json::Value timeoutAfterMatch = Json::objectValue;
  timeoutAfterMatch["timeout"] = testProperties.AlternateTimeout.count();
  timeoutAfterMatch["regex"] =
    DumpRegExToJsonArray(testProperties.TimeoutRegularExpressions);
  return timeoutAfterMatch;
}